

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckResultTypes
          (ScriptValidator *this,Location *loc,TypeVector *actual,TypeVector *expected,char *desc)

{
  pointer pTVar1;
  pointer pTVar2;
  size_t i;
  ulong uVar3;
  
  pTVar1 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pTVar2 - (long)pTVar1 >> 2 ==
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    for (uVar3 = 0; uVar3 < (ulong)((long)pTVar2 - (long)pTVar1 >> 2); uVar3 = uVar3 + 1) {
      CheckTypeIndex(this,loc,(Type)pTVar1[uVar3].enum_,
                     (Type)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar3].enum_,"action",
                     (Index)uVar3,"result");
      pTVar1 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    return;
  }
  PrintError(this,loc,"expected %zd results, got %zd");
  return;
}

Assistant:

void ScriptValidator::CheckResultTypes(const Location* loc,
                                       const TypeVector& actual,
                                       const TypeVector& expected,
                                       const char* desc) {
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      CheckTypeIndex(loc, actual[i], expected[i], desc, i, "result");
    }
  } else {
    PrintError(loc, "expected %" PRIzd " results, got %" PRIzd, expected.size(),
               actual.size());
  }
}